

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_releaseAllJobResources(ZSTDMT_CCtx *mtctx)

{
  undefined1 local_70 [8];
  pthread_cond_t cond;
  pthread_mutex_t mutex;
  ZSTDMT_CCtx *pZStack_10;
  uint jobID;
  ZSTDMT_CCtx *mtctx_local;
  
  pZStack_10 = mtctx;
  for (mutex._36_4_ = 0; (uint)mutex._36_4_ <= pZStack_10->jobIDMask;
      mutex._36_4_ = mutex._36_4_ + 1) {
    memcpy(cond.__data.__g_signals,&pZStack_10->jobs[(uint)mutex._36_4_].job_mutex,0x28);
    memcpy(local_70,&pZStack_10->jobs[(uint)mutex._36_4_].job_cond,0x30);
    ZSTDMT_releaseBuffer(pZStack_10->bufPool,pZStack_10->jobs[(uint)mutex._36_4_].dstBuff);
    memset(pZStack_10->jobs + (uint)mutex._36_4_,0,0x178);
    memcpy(&pZStack_10->jobs[(uint)mutex._36_4_].job_mutex,cond.__data.__g_signals,0x28);
    memcpy(&pZStack_10->jobs[(uint)mutex._36_4_].job_cond,local_70,0x30);
  }
  (pZStack_10->inBuff).buffer.start = (void *)0x0;
  (pZStack_10->inBuff).buffer.capacity = 0;
  (pZStack_10->inBuff).filled = 0;
  pZStack_10->allJobsCompleted = 1;
  return;
}

Assistant:

static void ZSTDMT_releaseAllJobResources(ZSTDMT_CCtx* mtctx)
{
    unsigned jobID;
    DEBUGLOG(3, "ZSTDMT_releaseAllJobResources");
    for (jobID=0; jobID <= mtctx->jobIDMask; jobID++) {
        /* Copy the mutex/cond out */
        ZSTD_pthread_mutex_t const mutex = mtctx->jobs[jobID].job_mutex;
        ZSTD_pthread_cond_t const cond = mtctx->jobs[jobID].job_cond;

        DEBUGLOG(4, "job%02u: release dst address %08X", jobID, (U32)(size_t)mtctx->jobs[jobID].dstBuff.start);
        ZSTDMT_releaseBuffer(mtctx->bufPool, mtctx->jobs[jobID].dstBuff);

        /* Clear the job description, but keep the mutex/cond */
        memset(&mtctx->jobs[jobID], 0, sizeof(mtctx->jobs[jobID]));
        mtctx->jobs[jobID].job_mutex = mutex;
        mtctx->jobs[jobID].job_cond = cond;
    }
    mtctx->inBuff.buffer = g_nullBuffer;
    mtctx->inBuff.filled = 0;
    mtctx->allJobsCompleted = 1;
}